

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O3

void __thiscall SQVM::PushNull(SQVM *this)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectPtr *pSVar3;
  long lVar4;
  SQTable *pSVar5;
  
  pSVar3 = (this->_stack)._vals;
  lVar4 = this->_top;
  this->_top = lVar4 + 1;
  pSVar5 = pSVar3[lVar4].super_SQObject._unVal.pTable;
  SVar2 = pSVar3[lVar4].super_SQObject._type;
  pSVar3[lVar4].super_SQObject._type = OT_NULL;
  pSVar3[lVar4].super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
      return;
    }
  }
  return;
}

Assistant:

inline T& operator[](SQUnsignedInteger pos) const{ return _vals[pos]; }